

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint isGrayICCProfile(uchar *profile,uint size)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((0x13 < size) && (profile[0x10] == 'G')) && (profile[0x11] == 'R')) &&
     (profile[0x12] == 'A')) {
    uVar1 = (uint)(profile[0x13] == 'Y');
  }
  return uVar1;
}

Assistant:

static unsigned isGrayICCProfile(const unsigned char* profile, unsigned size) {
  /*
  It is a gray profile if bytes 16-19 are "GRAY", rgb profile if bytes 16-19
  are "RGB ". We do not perform any full parsing of the ICC profile here, other
  than check those 4 bytes to grayscale profile. Other than that, validity of
  the profile is not checked. This is needed only because the PNG specification
  requires using a non-gray color model if there is an ICC profile with "RGB "
  (sadly limiting compression opportunities if the input data is grayscale RGB
  data), and requires using a gray color model if it is "GRAY".
  */
  if (size < 20) return 0;
  return profile[16] == 'G' && profile[17] == 'R' && profile[18] == 'A' && profile[19] == 'Y';
}